

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_598a4::CpuAbsoluteIndexedTest_slo_absx_sets_c_with_pagecrossing_Test::
CpuAbsoluteIndexedTest_slo_absx_sets_c_with_pagecrossing_Test
          (CpuAbsoluteIndexedTest_slo_absx_sets_c_with_pagecrossing_Test *this)

{
  CpuAbsoluteIndexedTest_slo_absx_sets_c_with_pagecrossing_Test *this_local;
  
  CpuAbsoluteIndexedTest::CpuAbsoluteIndexedTest(&this->super_CpuAbsoluteIndexedTest);
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.super_Test._vptr_Test =
       (_func_int **)&PTR__CpuAbsoluteIndexedTest_slo_absx_sets_c_with_pagecrossing_Test_003ecd28;
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest, slo_absx_sets_c_with_pagecrossing) {
    registers.p = Z_FLAG;
    registers.a = 0b01110000;
    expected.a = 0b01110010;
    expected.p = C_FLAG;
    memory_content = 0b10000001;

    run_readwrite_instruction_with_pagecrossing(
            SLO_ABSX, IndexReg::X, 0b00000010);
}